

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

void secp256k1_nonce_function_musig_sha256_tagged(secp256k1_sha256 *sha)

{
  secp256k1_sha256_initialize(sha);
  sha->s[0] = 0x7101b64;
  sha->s[1] = 0x18003414;
  sha->s[2] = 0x391bc43;
  sha->s[3] = 0xe6258ee;
  sha->s[4] = 0x29d26b72;
  sha->s[5] = 0x8343937e;
  sha->s[6] = 0xb7a0a4fb;
  sha->s[7] = 0xff568a30;
  sha->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_nonce_function_musig_sha256_tagged(secp256k1_sha256 *sha) {
    secp256k1_sha256_initialize(sha);
    sha->s[0] = 0x07101b64ul;
    sha->s[1] = 0x18003414ul;
    sha->s[2] = 0x0391bc43ul;
    sha->s[3] = 0x0e6258eeul;
    sha->s[4] = 0x29d26b72ul;
    sha->s[5] = 0x8343937eul;
    sha->s[6] = 0xb7a0a4fbul;
    sha->s[7] = 0xff568a30ul;
    sha->bytes = 64;
}